

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_str.c
# Opt level: O0

char * error_str(int i)

{
  char *pcStack_10;
  int i_local;
  
  if (i == 0) {
    pcStack_10 = "no error";
  }
  else if (i == error_intr) {
    pcStack_10 = "interrupted system call";
  }
  else if (i == error_nomem) {
    pcStack_10 = "out of memory";
  }
  else if (i == error_noent) {
    pcStack_10 = "file does not exist";
  }
  else if (i == error_txtbsy) {
    pcStack_10 = "text busy";
  }
  else if (i == error_io) {
    pcStack_10 = "input/output error";
  }
  else if (i == error_exist) {
    pcStack_10 = "file already exists";
  }
  else if (i == error_timeout) {
    pcStack_10 = "timed out";
  }
  else if (i == error_inprogress) {
    pcStack_10 = "operation in progress";
  }
  else if (i == error_again) {
    pcStack_10 = "temporary failure";
  }
  else if (i == error_wouldblock) {
    pcStack_10 = "input/output would block";
  }
  else if (i == error_pipe) {
    pcStack_10 = "broken pipe";
  }
  else if (i == error_perm) {
    pcStack_10 = "permission denied";
  }
  else if (i == error_acces) {
    pcStack_10 = "access denied";
  }
  else if (i == error_nodevice) {
    pcStack_10 = "device not configured";
  }
  else if (i == error_proto) {
    pcStack_10 = "protocol error";
  }
  else if (i == error_isdir) {
    pcStack_10 = "is a directory";
  }
  else if (i == error_connrefused) {
    pcStack_10 = "connection refused";
  }
  else if (i == error_notdir) {
    pcStack_10 = "not a directory";
  }
  else if (i == 3) {
    pcStack_10 = "no such process";
  }
  else if (i == 7) {
    pcStack_10 = "argument list too long";
  }
  else if (i == 8) {
    pcStack_10 = "exec format error";
  }
  else if (i == 9) {
    pcStack_10 = "file descriptor not open";
  }
  else if (i == 10) {
    pcStack_10 = "no child processes";
  }
  else if (i == 0x23) {
    pcStack_10 = "operation would cause deadlock";
  }
  else if (i == 0xe) {
    pcStack_10 = "bad address";
  }
  else if (i == 0xf) {
    pcStack_10 = "not a block device";
  }
  else if (i == 0x10) {
    pcStack_10 = "device busy";
  }
  else if (i == 0x12) {
    pcStack_10 = "cross-device link";
  }
  else if (i == 0x13) {
    pcStack_10 = "device does not support operation";
  }
  else if (i == 0x16) {
    pcStack_10 = "invalid argument";
  }
  else if (i == 0x17) {
    pcStack_10 = "system cannot open more files";
  }
  else if (i == 0x18) {
    pcStack_10 = "process cannot open more files";
  }
  else if (i == 0x19) {
    pcStack_10 = "not a tty";
  }
  else if (i == 0x1b) {
    pcStack_10 = "file too big";
  }
  else if (i == 0x1c) {
    pcStack_10 = "out of disk space";
  }
  else if (i == 0x1d) {
    pcStack_10 = "unseekable descriptor";
  }
  else if (i == 0x1e) {
    pcStack_10 = "read-only file system";
  }
  else if (i == 0x1f) {
    pcStack_10 = "too many links";
  }
  else if (i == 0x21) {
    pcStack_10 = "input out of range";
  }
  else if (i == 0x22) {
    pcStack_10 = "output out of range";
  }
  else if (i == 0x72) {
    pcStack_10 = "operation already in progress";
  }
  else if (i == 0x58) {
    pcStack_10 = "not a socket";
  }
  else if (i == 0x59) {
    pcStack_10 = "destination address required";
  }
  else if (i == 0x5a) {
    pcStack_10 = "message too long";
  }
  else if (i == 0x5b) {
    pcStack_10 = "incorrect protocol type";
  }
  else if (i == 0x5c) {
    pcStack_10 = "protocol not available";
  }
  else if (i == 0x5d) {
    pcStack_10 = "protocol not supported";
  }
  else if (i == 0x5e) {
    pcStack_10 = "socket type not supported";
  }
  else if (i == 0x5f) {
    pcStack_10 = "operation not supported";
  }
  else if (i == 0x60) {
    pcStack_10 = "protocol family not supported";
  }
  else if (i == 0x61) {
    pcStack_10 = "address family not supported";
  }
  else if (i == 0x62) {
    pcStack_10 = "address already used";
  }
  else if (i == 99) {
    pcStack_10 = "address not available";
  }
  else if (i == 100) {
    pcStack_10 = "network down";
  }
  else if (i == 0x65) {
    pcStack_10 = "network unreachable";
  }
  else if (i == 0x66) {
    pcStack_10 = "network reset";
  }
  else if (i == 0x67) {
    pcStack_10 = "connection aborted";
  }
  else if (i == 0x68) {
    pcStack_10 = "connection reset";
  }
  else if (i == 0x69) {
    pcStack_10 = "out of buffer space";
  }
  else if (i == 0x6a) {
    pcStack_10 = "already connected";
  }
  else if (i == 0x6b) {
    pcStack_10 = "not connected";
  }
  else if (i == 0x6c) {
    pcStack_10 = "socket shut down";
  }
  else if (i == 0x6d) {
    pcStack_10 = "too many references";
  }
  else if (i == 0x28) {
    pcStack_10 = "symbolic link loop";
  }
  else if (i == 0x24) {
    pcStack_10 = "file name too long";
  }
  else if (i == 0x70) {
    pcStack_10 = "host down";
  }
  else if (i == 0x71) {
    pcStack_10 = "host unreachable";
  }
  else if (i == 0x27) {
    pcStack_10 = "directory not empty";
  }
  else if (i == 0x57) {
    pcStack_10 = "too many users";
  }
  else if (i == 0x7a) {
    pcStack_10 = "disk quota exceeded";
  }
  else if (i == 0x74) {
    pcStack_10 = "stale NFS file handle";
  }
  else if (i == 0x42) {
    pcStack_10 = "too many levels of remote in path";
  }
  else if (i == 0x25) {
    pcStack_10 = "no locks available";
  }
  else if (i == 0x26) {
    pcStack_10 = "system call not available";
  }
  else if (i == 0x3c) {
    pcStack_10 = "not a stream device";
  }
  else if (i == 0x3e) {
    pcStack_10 = "timer expired";
  }
  else if (i == 0x3f) {
    pcStack_10 = "out of stream resources";
  }
  else if (i == 0x2a) {
    pcStack_10 = "no message of desired type";
  }
  else if (i == 0x4a) {
    pcStack_10 = "bad message type";
  }
  else if (i == 0x2b) {
    pcStack_10 = "identifier removed";
  }
  else if (i == 0x40) {
    pcStack_10 = "machine not on network";
  }
  else if (i == 0x43) {
    pcStack_10 = "link severed";
  }
  else if (i == 0x44) {
    pcStack_10 = "advertise error";
  }
  else if (i == 0x45) {
    pcStack_10 = "srmount error";
  }
  else if (i == 0x46) {
    pcStack_10 = "communication error";
  }
  else if (i == 0x48) {
    pcStack_10 = "multihop attempted";
  }
  else if (i == 0x4e) {
    pcStack_10 = "remote address changed";
  }
  else {
    pcStack_10 = "unknown error";
  }
  return pcStack_10;
}

Assistant:

const char *error_str(int i)
{
  X(0,"no error")
  X(error_intr,"interrupted system call")
  X(error_nomem,"out of memory")
  X(error_noent,"file does not exist")
  X(error_txtbsy,"text busy")
  X(error_io,"input/output error")
  X(error_exist,"file already exists")
  X(error_timeout,"timed out")
  X(error_inprogress,"operation in progress")
  X(error_again,"temporary failure")
  X(error_wouldblock,"input/output would block")
  X(error_pipe,"broken pipe")
  X(error_perm,"permission denied")
  X(error_acces,"access denied")
  X(error_nodevice,"device not configured")
  X(error_proto,"protocol error")
  X(error_isdir,"is a directory")
  X(error_connrefused,"connection refused")
  X(error_notdir,"not a directory")
#ifdef ESRCH
  X(ESRCH,"no such process")
#endif
#ifdef E2BIG
  X(E2BIG,"argument list too long")
#endif
#ifdef ENOEXEC
  X(ENOEXEC,"exec format error")
#endif
#ifdef EBADF
  X(EBADF,"file descriptor not open")
#endif
#ifdef ECHILD
  X(ECHILD,"no child processes")
#endif
#ifdef EDEADLK
  X(EDEADLK,"operation would cause deadlock")
#endif
#ifdef EFAULT
  X(EFAULT,"bad address")
#endif
#ifdef ENOTBLK
  X(ENOTBLK,"not a block device")
#endif
#ifdef EBUSY
  X(EBUSY,"device busy")
#endif
#ifdef EXDEV
  X(EXDEV,"cross-device link")
#endif
#ifdef ENODEV
  X(ENODEV,"device does not support operation")
#endif
#ifdef EINVAL
  X(EINVAL,"invalid argument")
#endif
#ifdef ENFILE
  X(ENFILE,"system cannot open more files")
#endif
#ifdef EMFILE
  X(EMFILE,"process cannot open more files")
#endif
#ifdef ENOTTY
  X(ENOTTY,"not a tty")
#endif
#ifdef EFBIG
  X(EFBIG,"file too big")
#endif
#ifdef ENOSPC
  X(ENOSPC,"out of disk space")
#endif
#ifdef ESPIPE
  X(ESPIPE,"unseekable descriptor")
#endif
#ifdef EROFS
  X(EROFS,"read-only file system")
#endif
#ifdef EMLINK
  X(EMLINK,"too many links")
#endif
#ifdef EDOM
  X(EDOM,"input out of range")
#endif
#ifdef ERANGE
  X(ERANGE,"output out of range")
#endif
#ifdef EALREADY
  X(EALREADY,"operation already in progress")
#endif
#ifdef ENOTSOCK
  X(ENOTSOCK,"not a socket")
#endif
#ifdef EDESTADDRREQ
  X(EDESTADDRREQ,"destination address required")
#endif
#ifdef EMSGSIZE
  X(EMSGSIZE,"message too long")
#endif
#ifdef EPROTOTYPE
  X(EPROTOTYPE,"incorrect protocol type")
#endif
#ifdef ENOPROTOOPT
  X(ENOPROTOOPT,"protocol not available")
#endif
#ifdef EPROTONOSUPPORT
  X(EPROTONOSUPPORT,"protocol not supported")
#endif
#ifdef ESOCKTNOSUPPORT
  X(ESOCKTNOSUPPORT,"socket type not supported")
#endif
#ifdef EOPNOTSUPP
  X(EOPNOTSUPP,"operation not supported")
#endif
#ifdef EPFNOSUPPORT
  X(EPFNOSUPPORT,"protocol family not supported")
#endif
#ifdef EAFNOSUPPORT
  X(EAFNOSUPPORT,"address family not supported")
#endif
#ifdef EADDRINUSE
  X(EADDRINUSE,"address already used")
#endif
#ifdef EADDRNOTAVAIL
  X(EADDRNOTAVAIL,"address not available")
#endif
#ifdef ENETDOWN
  X(ENETDOWN,"network down")
#endif
#ifdef ENETUNREACH
  X(ENETUNREACH,"network unreachable")
#endif
#ifdef ENETRESET
  X(ENETRESET,"network reset")
#endif
#ifdef ECONNABORTED
  X(ECONNABORTED,"connection aborted")
#endif
#ifdef ECONNRESET
  X(ECONNRESET,"connection reset")
#endif
#ifdef ENOBUFS
  X(ENOBUFS,"out of buffer space")
#endif
#ifdef EISCONN
  X(EISCONN,"already connected")
#endif
#ifdef ENOTCONN
  X(ENOTCONN,"not connected")
#endif
#ifdef ESHUTDOWN
  X(ESHUTDOWN,"socket shut down")
#endif
#ifdef ETOOMANYREFS
  X(ETOOMANYREFS,"too many references")
#endif
#ifdef ELOOP
  X(ELOOP,"symbolic link loop")
#endif
#ifdef ENAMETOOLONG
  X(ENAMETOOLONG,"file name too long")
#endif
#ifdef EHOSTDOWN
  X(EHOSTDOWN,"host down")
#endif
#ifdef EHOSTUNREACH
  X(EHOSTUNREACH,"host unreachable")
#endif
#ifdef ENOTEMPTY
  X(ENOTEMPTY,"directory not empty")
#endif
#ifdef EPROCLIM
  X(EPROCLIM,"too many processes")
#endif
#ifdef EUSERS
  X(EUSERS,"too many users")
#endif
#ifdef EDQUOT
  X(EDQUOT,"disk quota exceeded")
#endif
#ifdef ESTALE
  X(ESTALE,"stale NFS file handle")
#endif
#ifdef EREMOTE
  X(EREMOTE,"too many levels of remote in path")
#endif
#ifdef EBADRPC
  X(EBADRPC,"RPC structure is bad")
#endif
#ifdef ERPCMISMATCH
  X(ERPCMISMATCH,"RPC version mismatch")
#endif
#ifdef EPROGUNAVAIL
  X(EPROGUNAVAIL,"RPC program unavailable")
#endif
#ifdef EPROGMISMATCH
  X(EPROGMISMATCH,"program version mismatch")
#endif
#ifdef EPROCUNAVAIL
  X(EPROCUNAVAIL,"bad procedure for program")
#endif
#ifdef ENOLCK
  X(ENOLCK,"no locks available")
#endif
#ifdef ENOSYS
  X(ENOSYS,"system call not available")
#endif
#ifdef EFTYPE
  X(EFTYPE,"bad file type")
#endif
#ifdef EAUTH
  X(EAUTH,"authentication error")
#endif
#ifdef ENEEDAUTH
  X(ENEEDAUTH,"not authenticated")
#endif
#ifdef ENOSTR
  X(ENOSTR,"not a stream device")
#endif
#ifdef ETIME
  X(ETIME,"timer expired")
#endif
#ifdef ENOSR
  X(ENOSR,"out of stream resources")
#endif
#ifdef ENOMSG
  X(ENOMSG,"no message of desired type")
#endif
#ifdef EBADMSG
  X(EBADMSG,"bad message type")
#endif
#ifdef EIDRM
  X(EIDRM,"identifier removed")
#endif
#ifdef ENONET
  X(ENONET,"machine not on network")
#endif
#ifdef ERREMOTE
  X(ERREMOTE,"object not local")
#endif
#ifdef ENOLINK
  X(ENOLINK,"link severed")
#endif
#ifdef EADV
  X(EADV,"advertise error")
#endif
#ifdef ESRMNT
  X(ESRMNT,"srmount error")
#endif
#ifdef ECOMM
  X(ECOMM,"communication error")
#endif
#ifdef EMULTIHOP
  X(EMULTIHOP,"multihop attempted")
#endif
#ifdef EREMCHG
  X(EREMCHG,"remote address changed")
#endif
  return "unknown error";
}